

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
GetGenericProperty<std::__cxx11::string>
          (map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *list,char *szName,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *errorReturn)

{
  bool bVar1;
  reference ppVar2;
  _Self local_40;
  _Self local_38;
  const_iterator it;
  uint32_t hash;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *errorReturn_local;
  char *szName_local;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *list_local;
  
  if (szName == (char *)0x0) {
    __assert_fail("nullptr != szName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/GenericProperty.h"
                  ,0x4b,
                  "const T &GetGenericProperty(const std::map<unsigned int, T> &, const char *, const T &) [T = std::basic_string<char>]"
                 );
  }
  it._M_node._4_4_ = SuperFastHash(szName,0,0);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(list,(key_type *)((long)&it._M_node + 4));
  local_40._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(list);
  bVar1 = std::operator==(&local_38,&local_40);
  list_local = (map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)errorReturn;
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&local_38);
    list_local = (map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&ppVar2->second;
  }
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)list_local;
}

Assistant:

inline
const T& GetGenericProperty(const std::map< unsigned int, T >& list,
        const char* szName, const T& errorReturn) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::const_iterator it = list.find(hash);
    if (it == list.end()) {
        return errorReturn;
    }

    return (*it).second;
}